

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall
duckdb_parquet::ColumnMetaData::read(ColumnMetaData *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer pKVar3;
  pointer pKVar4;
  pointer ptVar5;
  value_type vVar6;
  vector<duckdb_parquet::KeyValue,_true> *this_00;
  vector<duckdb_parquet::PageEncodingStats,_true> *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  reference pvVar11;
  reference pvVar12;
  undefined4 extraout_var_00;
  ssize_t sVar13;
  reference pvVar14;
  reference pvVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 *puVar16;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_02;
  pointer pPVar17;
  size_type __n;
  size_type __n_00;
  pointer pKVar18;
  size_type __n_01;
  size_type __n_02;
  int32_t ecast97;
  TType _etype118;
  int16_t fid;
  string fname;
  int32_t ecast103;
  TType ftype;
  type local_114;
  undefined1 local_110 [6];
  ushort local_10a;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  value_type local_e8;
  int local_e4;
  vector<duckdb_parquet::KeyValue,_true> *local_e0;
  vector<duckdb_parquet::PageEncodingStats,_true> *local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  vector<duckdb_parquet::Encoding::type,_true> *local_88;
  int64_t *local_80;
  int64_t *local_78;
  int64_t *local_70;
  int64_t *local_68;
  int64_t *local_60;
  int64_t *local_58;
  Statistics *local_50;
  int64_t *local_48;
  int32_t *local_40;
  SizeStatistics *local_38;
  
  this_02 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_02);
  local_108 = local_f8;
  local_100 = 0;
  local_f8[0] = 0;
  iVar8 = (*this_02->_vptr_TProtocol[0x19])(this_02,&local_108);
  local_38 = &this->size_statistics;
  local_40 = &this->bloom_filter_length;
  local_48 = &this->bloom_filter_offset;
  local_d8 = &this->encoding_stats;
  local_50 = &this->statistics;
  local_58 = &this->dictionary_page_offset;
  local_60 = &this->index_page_offset;
  local_68 = &this->data_page_offset;
  local_e0 = &this->key_value_metadata;
  local_70 = &this->total_compressed_size;
  local_78 = &this->total_uncompressed_size;
  local_80 = &this->num_values;
  local_d0 = &this->path_in_schema;
  local_88 = &this->encodings;
  local_90 = 0;
  local_c0 = 0;
  local_c8 = 0;
  local_98 = 0;
  local_a0 = 0;
  local_a8 = 0;
  local_b0 = 0;
  local_b8 = 0;
  do {
    iVar9 = (*this_02->_vptr_TProtocol[0x1b])(this_02,&local_108,&local_e4,&local_10a);
    pvVar7 = local_d0;
    iVar9 = iVar9 + iVar8;
    if (local_e4 == 0) {
      iVar8 = (*this_02->_vptr_TProtocol[0x1a])(this_02);
      if ((((((local_90 & 1) != 0) && ((local_c0 & 1) != 0)) && ((local_c8 & 1) != 0)) &&
          (((local_98 & 1) != 0 && ((local_a0 & 1) != 0)))) &&
         (((local_a8 & 1) != 0 && (((local_b0 & 1) != 0 && ((local_b8 & 1) != 0)))))) {
        if (local_108 != local_f8) {
          operator_delete(local_108);
        }
        this_02->input_recursion_depth_ = this_02->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar8 + iVar9);
      }
      puVar16 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar16[1] = puVar16 + 3;
      puVar16[2] = 0;
      *(undefined1 *)(puVar16 + 3) = 0;
      *puVar16 = &PTR__TException_004a37c0;
      *(undefined4 *)(puVar16 + 5) = 1;
      __cxa_throw(puVar16,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    switch(local_10a) {
    case 1:
      if (local_e4 != 8) {
        iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
        break;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x27])(this_02,&local_114);
      iVar10 = iVar10 + iVar9;
      this->type = local_114;
      local_90 = CONCAT71((uint7)(uint3)(local_114 >> 8),1);
      goto LAB_002d16e2;
    case 2:
      if (local_e4 == 0xf) {
        ptVar5 = (this->encodings).
                 super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                 .
                 super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->encodings).
            super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
            .
            super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
            ._M_impl.super__Vector_impl_data._M_finish != ptVar5) {
          (this->encodings).
          super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
          .
          super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
          ._M_impl.super__Vector_impl_data._M_finish = ptVar5;
        }
        iVar10 = (*this_02->_vptr_TProtocol[0x1f])(this_02,local_110,&local_114);
        std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
        ::resize(&local_88->
                  super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                 ,(ulong)local_114);
        iVar10 = iVar10 + iVar9;
        if (local_114 != BOOLEAN) {
          __n_02 = 0;
          do {
            iVar8 = (*this_02->_vptr_TProtocol[0x27])(this_02,&local_e8);
            vVar6 = local_e8;
            pvVar15 = duckdb::vector<duckdb_parquet::Encoding::type,_true>::operator[]
                                (local_88,__n_02);
            iVar10 = iVar10 + iVar8;
            *pvVar15 = vVar6;
            __n_02 = __n_02 + 1;
          } while (__n_02 < local_114);
        }
        iVar8 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar10 = iVar8 + iVar10;
        local_c0 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar8) >> 8),1);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 3:
      if (local_e4 == 0xf) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&local_d0->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
        iVar10 = (*this_02->_vptr_TProtocol[0x1f])(this_02,local_110,&local_114);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&pvVar7->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ,(ulong)local_114);
        pvVar7 = local_d0;
        iVar10 = iVar10 + iVar9;
        if (local_114 != BOOLEAN) {
          __n_00 = 0;
          do {
            pvVar12 = duckdb::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](pvVar7,__n_00);
            iVar8 = (*this_02->_vptr_TProtocol[0x2a])(this_02,pvVar12);
            iVar10 = iVar10 + iVar8;
            __n_00 = __n_00 + 1;
          } while (__n_00 < local_114);
        }
        iVar8 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar10 = iVar8 + iVar10;
        local_c8 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar8) >> 8),1);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 4:
      if (local_e4 == 8) {
        iVar10 = (*this_02->_vptr_TProtocol[0x27])(this_02,&local_114);
        iVar10 = iVar10 + iVar9;
        this->codec = local_114;
        local_98 = CONCAT71((uint7)(uint3)(local_114 >> 8),1);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 5:
      if (local_e4 == 10) {
        iVar8 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_80);
        iVar10 = iVar8 + iVar9;
        local_a0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar8) >> 8),1);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 6:
      if (local_e4 == 10) {
        iVar8 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_78);
        iVar10 = iVar8 + iVar9;
        local_a8 = CONCAT71((int7)(CONCAT44(extraout_var_02,iVar8) >> 8),1);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 7:
      if (local_e4 == 10) {
        iVar8 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_70);
        iVar10 = iVar8 + iVar9;
        local_b0 = CONCAT71((int7)(CONCAT44(extraout_var_03,iVar8) >> 8),1);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 8:
      if (local_e4 == 0xf) {
        pKVar3 = (this->key_value_metadata).
                 super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
                 super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pKVar4 = (this->key_value_metadata).
                 super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
                 super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pKVar18 = pKVar3;
        if (pKVar4 != pKVar3) {
          do {
            (*(code *)**(undefined8 **)pKVar18)(pKVar18);
            pKVar18 = pKVar18 + 1;
          } while (pKVar18 != pKVar4);
          (this->key_value_metadata).
          super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
          super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
          _M_impl.super__Vector_impl_data._M_finish = pKVar3;
        }
        iVar8 = (*this_02->_vptr_TProtocol[0x1f])(this_02,local_110,&local_114);
        std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::resize
                  (&local_e0->
                    super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   ,(ulong)local_114);
        this_00 = local_e0;
        iVar8 = iVar8 + iVar9;
        if (local_114 != BOOLEAN) {
          __n_01 = 0;
          do {
            pvVar14 = duckdb::vector<duckdb_parquet::KeyValue,_true>::operator[](this_00,__n_01);
            iVar9 = (**(code **)(*(long *)pvVar14 + 0x10))(pvVar14,this_02);
            iVar8 = iVar8 + iVar9;
            __n_01 = __n_01 + 1;
          } while (__n_01 < local_114);
        }
        iVar10 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar10 = iVar10 + iVar8;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset | 1);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 9:
      if (local_e4 == 10) {
        iVar8 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_68);
        iVar10 = iVar8 + iVar9;
        local_b8 = CONCAT71((int7)(CONCAT44(extraout_var_04,iVar8) >> 8),1);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 10:
      if (local_e4 == 10) {
        iVar10 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_60);
        iVar10 = iVar10 + iVar9;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset | 2);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 0xb:
      if (local_e4 == 10) {
        iVar10 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_58);
        iVar10 = iVar10 + iVar9;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset | 4);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 0xc:
      if (local_e4 == 0xc) {
        sVar13 = Statistics::read(local_50,__fd,__buf_00,0x3c51e4);
        iVar10 = (int)sVar13 + iVar9;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset | 8);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 0xd:
      if (local_e4 == 0xf) {
        pPVar1 = (this->encoding_stats).
                 super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                 .
                 super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar2 = (this->encoding_stats).
                 super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                 .
                 super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pPVar17 = pPVar1;
        if (pPVar2 != pPVar1) {
          do {
            (*(code *)**(undefined8 **)pPVar17)(pPVar17);
            pPVar17 = pPVar17 + 1;
          } while (pPVar17 != pPVar2);
          (this->encoding_stats).
          super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
          .
          super__Vector_base<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
          ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
        }
        iVar8 = (*this_02->_vptr_TProtocol[0x1f])(this_02,local_110,&local_114);
        std::
        vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
        ::resize(&local_d8->
                  super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
                 ,(ulong)local_114);
        this_01 = local_d8;
        iVar8 = iVar8 + iVar9;
        if (local_114 != BOOLEAN) {
          __n = 0;
          do {
            pvVar11 = duckdb::vector<duckdb_parquet::PageEncodingStats,_true>::operator[]
                                (this_01,__n);
            iVar9 = (**(code **)(*(long *)pvVar11 + 0x10))(pvVar11,this_02);
            iVar8 = iVar8 + iVar9;
            __n = __n + 1;
          } while (__n < local_114);
        }
        iVar10 = (*this_02->_vptr_TProtocol[0x20])(this_02);
        iVar10 = iVar10 + iVar8;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset | 0x10);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 0xe:
      if (local_e4 == 10) {
        iVar10 = (*this_02->_vptr_TProtocol[0x28])(this_02,local_48);
        iVar10 = iVar10 + iVar9;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset | 0x20);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 0xf:
      if (local_e4 == 8) {
        iVar10 = (*this_02->_vptr_TProtocol[0x27])(this_02,local_40);
        iVar10 = iVar10 + iVar9;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset | 0x40);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    case 0x10:
      if (local_e4 == 0xc) {
        sVar13 = SizeStatistics::read(local_38,__fd,__buf_00,0x3c51e4);
        iVar10 = (int)sVar13 + iVar9;
        this->__isset = (_ColumnMetaData__isset)((byte)this->__isset | 0x80);
        goto LAB_002d16e2;
      }
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
      break;
    default:
      iVar10 = (*this_02->_vptr_TProtocol[0x2c])(this_02);
    }
    iVar10 = iVar10 + iVar9;
LAB_002d16e2:
    iVar8 = (*this_02->_vptr_TProtocol[0x1c])(this_02);
    iVar8 = iVar8 + iVar10;
  } while( true );
}

Assistant:

uint32_t ColumnMetaData::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_type = false;
  bool isset_encodings = false;
  bool isset_path_in_schema = false;
  bool isset_codec = false;
  bool isset_num_values = false;
  bool isset_total_uncompressed_size = false;
  bool isset_total_compressed_size = false;
  bool isset_data_page_offset = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast97;
          xfer += iprot->readI32(ecast97);
          this->type = static_cast<Type::type>(ecast97);
          isset_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->encodings.clear();
            uint32_t _size98;
            ::apache::thrift::protocol::TType _etype101;
            xfer += iprot->readListBegin(_etype101, _size98);
            this->encodings.resize(_size98);
            uint32_t _i102;
            for (_i102 = 0; _i102 < _size98; ++_i102)
            {
              int32_t ecast103;
              xfer += iprot->readI32(ecast103);
              this->encodings[_i102] = static_cast<Encoding::type>(ecast103);
            }
            xfer += iprot->readListEnd();
          }
          isset_encodings = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->path_in_schema.clear();
            uint32_t _size104;
            ::apache::thrift::protocol::TType _etype107;
            xfer += iprot->readListBegin(_etype107, _size104);
            this->path_in_schema.resize(_size104);
            uint32_t _i108;
            for (_i108 = 0; _i108 < _size104; ++_i108)
            {
              xfer += iprot->readString(this->path_in_schema[_i108]);
            }
            xfer += iprot->readListEnd();
          }
          isset_path_in_schema = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast109;
          xfer += iprot->readI32(ecast109);
          this->codec = static_cast<CompressionCodec::type>(ecast109);
          isset_codec = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->num_values);
          isset_num_values = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_uncompressed_size);
          isset_total_uncompressed_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_compressed_size);
          isset_total_compressed_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->key_value_metadata.clear();
            uint32_t _size110;
            ::apache::thrift::protocol::TType _etype113;
            xfer += iprot->readListBegin(_etype113, _size110);
            this->key_value_metadata.resize(_size110);
            uint32_t _i114;
            for (_i114 = 0; _i114 < _size110; ++_i114)
            {
              xfer += this->key_value_metadata[_i114].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.key_value_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->data_page_offset);
          isset_data_page_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->index_page_offset);
          this->__isset.index_page_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 11:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->dictionary_page_offset);
          this->__isset.dictionary_page_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 12:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->statistics.read(iprot);
          this->__isset.statistics = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 13:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->encoding_stats.clear();
            uint32_t _size115;
            ::apache::thrift::protocol::TType _etype118;
            xfer += iprot->readListBegin(_etype118, _size115);
            this->encoding_stats.resize(_size115);
            uint32_t _i119;
            for (_i119 = 0; _i119 < _size115; ++_i119)
            {
              xfer += this->encoding_stats[_i119].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.encoding_stats = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 14:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->bloom_filter_offset);
          this->__isset.bloom_filter_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 15:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->bloom_filter_length);
          this->__isset.bloom_filter_length = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 16:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->size_statistics.read(iprot);
          this->__isset.size_statistics = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_type)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_encodings)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_path_in_schema)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_codec)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_num_values)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_total_uncompressed_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_total_compressed_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_data_page_offset)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}